

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Merge_distr_patch64(int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer local_128 [7];
  long lStack_f0;
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar2 = pnga_ndim((long)g_b);
  lVar3 = IVar1;
  if (0 < IVar1) {
    do {
      (&lStack_70)[lVar3] = *alo + 1;
      alo = alo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (0 < IVar1) {
    do {
      (&lStack_b0)[IVar1] = *ahi + 1;
      ahi = ahi + 1;
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  lVar3 = lVar2;
  if (0 < lVar2) {
    do {
      (&lStack_f0)[lVar3] = *blo + 1;
      blo = blo + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (0 < lVar2) {
    do {
      local_128[lVar2 + -1] = *bhi + 1;
      bhi = bhi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  pnga_merge_distr_patch((long)g_a,local_68,local_a8,(long)g_b,local_e8,local_128);
  return;
}

Assistant:

void NGA_Merge_distr_patch64(int g_a, int64_t *alo, int64_t *ahi,
                             int g_b, int64_t *blo, int64_t *bhi)
{
    Integer a = (Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    wnga_merge_distr_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi);
}